

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

GPU_ShaderBlock GPU_GetShaderBlock(void)

{
  GPU_ShaderBlock GVar1;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    return _gpu_current_renderer->current_context_target->context->current_shader_block;
  }
  GVar1.color_loc = -1;
  GVar1.modelViewProjection_loc = -1;
  GVar1.position_loc = -1;
  GVar1.texcoord_loc = -1;
  return GVar1;
}

Assistant:

GPU_ShaderBlock GPU_GetShaderBlock(void)
{
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
    {
        GPU_ShaderBlock b;
        b.position_loc = -1;
        b.texcoord_loc = -1;
        b.color_loc = -1;
        b.modelViewProjection_loc = -1;
        return b;
    }

    return _gpu_current_renderer->current_context_target->context->current_shader_block;
}